

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_composites.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_1::GetExtractInsertValueType
          (ValidationState_t *_,Instruction *inst,uint32_t *member_type)

{
  ushort uVar1;
  pointer puVar2;
  bool bVar3;
  ValidationState_t *this;
  bool bVar4;
  uint32_t uVar5;
  int32_t iVar6;
  DiagnosticStream *pDVar7;
  Instruction *pIVar8;
  Instruction *pIVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint64_t array_size;
  spv_result_t local_23c;
  char *local_228;
  ValidationState_t *local_220;
  char *local_218;
  ulong local_210;
  DiagnosticStream local_208;
  
  uVar1 = (inst->inst_).opcode;
  local_220 = _;
  if (1 < uVar1 - 0x51) {
    __assert_fail("opcode == spv::Op::OpCompositeExtract || opcode == spv::Op::OpCompositeInsert",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                  ,0x28,
                  "spv_result_t spvtools::val::(anonymous namespace)::GetExtractInsertValueType(ValidationState_t &, const Instruction *, uint32_t *)"
                 );
  }
  uVar13 = uVar1 == OpCompositeExtract ^ 5;
  puVar2 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar15 = (ulong)((long)(inst->words_).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar2) >> 2;
  uVar14 = (uint)uVar15;
  if (uVar14 == uVar13) {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,"Expected at least one index to Op",0x21);
    local_228 = spvOpcodeString((uint)(inst->inst_).opcode);
    pDVar7 = DiagnosticStream::operator<<(&local_208,&local_228);
    pcVar12 = ", zero found";
    lVar10 = 0xc;
  }
  else {
    if (uVar14 - uVar13 < 0x100) {
      uVar16 = (ulong)uVar13;
      uVar5 = ValidationState_t::GetTypeId(_,puVar2[uVar16 - 1]);
      this = local_220;
      *member_type = uVar5;
      if (uVar5 != 0) {
        if (uVar13 < uVar14) {
          local_210 = uVar15 & 0xffffffff;
          do {
            uVar13 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar16];
            pcVar12 = (char *)(ulong)uVar13;
            pIVar8 = ValidationState_t::FindDef(this,*member_type);
            if (pIVar8 == (Instruction *)0x0) {
              __assert_fail("type_inst",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                            ,0x44,
                            "spv_result_t spvtools::val::(anonymous namespace)::GetExtractInsertValueType(ValidationState_t &, const Instruction *, uint32_t *)"
                           );
            }
            uVar1 = (pIVar8->inst_).opcode;
            if (0x1167 < uVar1) {
              if (uVar1 < 0x14a8) {
                if ((uVar1 == 0x1168) || (uVar1 == 0x13d4)) {
switchD_006273bb_caseD_1d:
                  *member_type = (pIVar8->words_).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[2];
                  goto LAB_00627458;
                }
              }
              else if ((uVar1 == 0x14a8) || (uVar1 == 0x14ee)) goto switchD_006273bb_caseD_1d;
switchD_006273bb_caseD_19:
              ValidationState_t::diag(&local_208,this,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,
                         "Reached non-composite type while indexes still remain to be traversed.",
                         0x46);
              local_23c = local_208.error_;
              DiagnosticStream::~DiagnosticStream(&local_208);
              bVar3 = false;
              goto LAB_0062745a;
            }
            switch(uVar1) {
            case 0x17:
              puVar2 = (pIVar8->words_).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              *member_type = puVar2[2];
              uVar14 = puVar2[3];
              if (uVar14 <= uVar13) {
                ValidationState_t::diag(&local_208,this,SPV_ERROR_INVALID_DATA,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"Vector access is out of bounds, vector size is ",
                           0x2f);
                std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                lVar10 = 0x16;
                pcVar12 = ", but access index is ";
LAB_0062750c:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,pcVar12,lVar10);
                std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                local_23c = local_208.error_;
                DiagnosticStream::~DiagnosticStream(&local_208);
              }
              goto LAB_00627534;
            case 0x18:
              puVar2 = (pIVar8->words_).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              *member_type = puVar2[2];
              uVar14 = puVar2[3];
              if (uVar14 <= uVar13) {
                ValidationState_t::diag(&local_208,this,SPV_ERROR_INVALID_DATA,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"Matrix access is out of bounds, matrix has ",0x2b)
                ;
                std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                lVar10 = 0x1e;
                pcVar12 = " columns, but access index is ";
                goto LAB_0062750c;
              }
LAB_00627534:
              if (uVar13 < uVar14) break;
              bVar3 = false;
              goto LAB_0062745a;
            default:
              goto switchD_006273bb_caseD_19;
            case 0x1c:
              local_228 = (char *)0x0;
              pIVar9 = ValidationState_t::FindDef
                                 (this,(pIVar8->words_).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start[3]);
              *member_type = (pIVar8->words_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[2];
              iVar6 = spvOpcodeIsSpecConstant((uint)(pIVar9->inst_).opcode);
              bVar3 = true;
              if (iVar6 == 0) {
                bVar4 = ValidationState_t::EvalConstantValUint64
                                  (this,(pIVar8->words_).
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start[3],
                                   (uint64_t *)&local_228);
                if (!bVar4) {
                  __assert_fail("0 && \"Array type definition is corrupt\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_composites.cpp"
                                ,100,
                                "spv_result_t spvtools::val::(anonymous namespace)::GetExtractInsertValueType(ValidationState_t &, const Instruction *, uint32_t *)"
                               );
                }
                if (local_228 <= pcVar12) {
                  ValidationState_t::diag(&local_208,this,SPV_ERROR_INVALID_DATA,inst);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,"Array access is out of bounds, array size is ",
                             0x2d);
                  std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,", but access index is ",0x16);
                  std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                  local_23c = local_208.error_;
                  DiagnosticStream::~DiagnosticStream(&local_208);
                  bVar3 = false;
                }
              }
              if (!bVar3) {
LAB_0062774a:
                bVar3 = false;
                goto LAB_0062745a;
              }
              break;
            case 0x1d:
              goto switchD_006273bb_caseD_1d;
            case 0x1e:
              puVar2 = (pIVar8->words_).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pcVar11 = (char *)(((long)(pIVar8->words_).
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >>
                                 2) - 2);
              if (pcVar12 < pcVar11) {
                *member_type = puVar2[uVar13 + 2];
              }
              else {
                local_218 = pcVar11;
                ValidationState_t::diag(&local_208,this,SPV_ERROR_INVALID_DATA,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"Index is out of bounds, can not find index ",0x2b)
                ;
                std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208," in the structure <id> \'",0x18);
                std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"\'. This structure has ",0x16);
                std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208," members. Largest valid index is ",0x21);
                std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,".",1);
                local_23c = local_208.error_;
                DiagnosticStream::~DiagnosticStream(&local_208);
                pcVar11 = local_218;
              }
              if (pcVar11 <= pcVar12) goto LAB_0062774a;
            }
LAB_00627458:
            bVar3 = true;
LAB_0062745a:
            if (!bVar3) {
              return local_23c;
            }
            uVar16 = uVar16 + 1;
          } while (local_210 != uVar16);
        }
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"Expected Composite to be an object of composite type",0x34);
      goto LAB_00627314;
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,"The number of indexes in Op",0x1b);
    local_228 = spvOpcodeString((uint)uVar1);
    pDVar7 = DiagnosticStream::operator<<(&local_208,&local_228);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar7," may not exceed ",0x10);
    std::ostream::_M_insert<unsigned_long>((ulong)pDVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar7,". Found ",8);
    std::ostream::_M_insert<unsigned_long>((ulong)pDVar7);
    pcVar12 = " indexes.";
    lVar10 = 9;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar7,pcVar12,lVar10);
  local_208.error_ = pDVar7->error_;
LAB_00627314:
  DiagnosticStream::~DiagnosticStream(&local_208);
  return local_208.error_;
}

Assistant:

spv_result_t GetExtractInsertValueType(ValidationState_t& _,
                                       const Instruction* inst,
                                       uint32_t* member_type) {
  const spv::Op opcode = inst->opcode();
  assert(opcode == spv::Op::OpCompositeExtract ||
         opcode == spv::Op::OpCompositeInsert);
  uint32_t word_index = opcode == spv::Op::OpCompositeExtract ? 4 : 5;
  const uint32_t num_words = static_cast<uint32_t>(inst->words().size());
  const uint32_t composite_id_index = word_index - 1;
  const uint32_t num_indices = num_words - word_index;
  const uint32_t kCompositeExtractInsertMaxNumIndices = 255;

  if (num_indices == 0) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected at least one index to Op"
           << spvOpcodeString(inst->opcode()) << ", zero found";

  } else if (num_indices > kCompositeExtractInsertMaxNumIndices) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "The number of indexes in Op" << spvOpcodeString(opcode)
           << " may not exceed " << kCompositeExtractInsertMaxNumIndices
           << ". Found " << num_indices << " indexes.";
  }

  *member_type = _.GetTypeId(inst->word(composite_id_index));
  if (*member_type == 0) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Composite to be an object of composite type";
  }

  for (; word_index < num_words; ++word_index) {
    const uint32_t component_index = inst->word(word_index);
    const Instruction* const type_inst = _.FindDef(*member_type);
    assert(type_inst);
    switch (type_inst->opcode()) {
      case spv::Op::OpTypeVector: {
        *member_type = type_inst->word(2);
        const uint32_t vector_size = type_inst->word(3);
        if (component_index >= vector_size) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Vector access is out of bounds, vector size is "
                 << vector_size << ", but access index is " << component_index;
        }
        break;
      }
      case spv::Op::OpTypeMatrix: {
        *member_type = type_inst->word(2);
        const uint32_t num_cols = type_inst->word(3);
        if (component_index >= num_cols) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Matrix access is out of bounds, matrix has " << num_cols
                 << " columns, but access index is " << component_index;
        }
        break;
      }
      case spv::Op::OpTypeArray: {
        uint64_t array_size = 0;
        auto size = _.FindDef(type_inst->word(3));
        *member_type = type_inst->word(2);
        if (spvOpcodeIsSpecConstant(size->opcode())) {
          // Cannot verify against the size of this array.
          break;
        }

        if (!_.EvalConstantValUint64(type_inst->word(3), &array_size)) {
          assert(0 && "Array type definition is corrupt");
        }
        if (component_index >= array_size) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Array access is out of bounds, array size is "
                 << array_size << ", but access index is " << component_index;
        }
        break;
      }
      case spv::Op::OpTypeRuntimeArray:
      case spv::Op::OpTypeNodePayloadArrayAMDX: {
        *member_type = type_inst->word(2);
        // Array size is unknown.
        break;
      }
      case spv::Op::OpTypeStruct: {
        const size_t num_struct_members = type_inst->words().size() - 2;
        if (component_index >= num_struct_members) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Index is out of bounds, can not find index "
                 << component_index << " in the structure <id> '"
                 << type_inst->id() << "'. This structure has "
                 << num_struct_members << " members. Largest valid index is "
                 << num_struct_members - 1 << ".";
        }
        *member_type = type_inst->word(component_index + 2);
        break;
      }
      case spv::Op::OpTypeCooperativeVectorNV:
      case spv::Op::OpTypeCooperativeMatrixKHR:
      case spv::Op::OpTypeCooperativeMatrixNV: {
        *member_type = type_inst->word(2);
        break;
      }
      default:
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Reached non-composite type while indexes still remain to "
                  "be traversed.";
    }
  }

  return SPV_SUCCESS;
}